

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setDefaultButton(QMessageBox *this,QPushButton *button)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QMessageBoxPrivate *this_00;
  QPushButton *in_RSI;
  QPushButton *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  QPushButton **in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMessageBox *)0x7a55ca);
  QDialogButtonBox::buttons((QDialogButtonBox *)this_00);
  bVar2 = QListSpecialMethodsBase<QAbstractButton*>::contains<QPushButton*>
                    ((QListSpecialMethodsBase<QAbstractButton_*> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  bVar3 = bVar2 ^ 0xff;
  QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x7a5604);
  if ((bVar3 & 1) == 0) {
    this_00->defaultButton = in_RSI;
    QPushButton::setDefault(in_RDI,SUB81((ulong)this_00 >> 0x38,0));
    QWidget::setFocus((QWidget *)0x7a563a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::setDefaultButton(QPushButton *button)
{
    Q_D(QMessageBox);
    if (!d->buttonBox->buttons().contains(button))
        return;
    d->defaultButton = button;
    button->setDefault(true);
    button->setFocus();
}